

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attacks.h
# Opt level: O2

Bitboard __thiscall
libchess::Position::attackers_to(Position *this,Square square,Bitboard occupancy)

{
  Bitboard BVar1;
  PieceType pt;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (this->color_bb_[0].value_ &
           *(ulong *)(lookups::PAWN_ATTACKS +
                     (long)(int)square.super_MetaValueType<int>.value_ * 8 + 0x200) |
          this->color_bb_[1].value_ &
          *(ulong *)(lookups::PAWN_ATTACKS + (long)(int)square.super_MetaValueType<int>.value_ * 8))
          & this->piece_type_bb_[0].value_;
  for (lVar2 = 1; lVar2 != 6; lVar2 = lVar2 + 1) {
    BVar1 = lookups::non_pawn_piece_type_attacks
                      ((MetaValueType<int>)(value_type)lVar2,square,occupancy);
    uVar3 = uVar3 | BVar1.value_ & this->piece_type_bb_[lVar2].value_;
  }
  return (Bitboard)uVar3;
}

Assistant:

inline Bitboard Position::attackers_to(Square square, Bitboard occupancy) const {
    Bitboard attackers;
    attackers |= lookups::pawn_attacks(square, constants::WHITE) &
                 piece_type_bb(constants::PAWN, constants::BLACK);
    attackers |= lookups::pawn_attacks(square, constants::BLACK) &
                 piece_type_bb(constants::PAWN, constants::WHITE);
    for (PieceType pt = constants::KNIGHT; pt <= constants::KING; ++pt) {
        attackers |=
            lookups::non_pawn_piece_type_attacks(pt, square, occupancy) & piece_type_bb(pt);
    }
    return attackers;
}